

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O2

void cinatra::update<void>(sha1_context *ctx,void *message,size_t size)

{
  size_t sVar1;
  ulong __n;
  uint32_t block [16];
  
  while( true ) {
    __n = 0x40 - ctx->buflen;
    if (size <= __n) {
      __n = size;
    }
    memcpy(ctx->buf + ctx->buflen,message,__n);
    sVar1 = ctx->buflen + __n;
    ctx->buflen = sVar1;
    if (sVar1 != 0x40) break;
    ctx->buflen = 0;
    sha1::make_block(ctx->buf,block);
    sha1::transform<void>(ctx->digest,block);
    size = size - __n;
    message = (void *)((long)message + __n);
    ctx->blocks = ctx->blocks + 1;
  }
  return;
}

Assistant:

inline void update(sha1_context &ctx, void const *message,
                   std::size_t size) noexcept {
  auto p = reinterpret_cast<std::uint8_t const *>(message);
  for (;;) {
    auto const n = (std::min)(size, sizeof(ctx.buf) - ctx.buflen);
    std::memcpy(ctx.buf + ctx.buflen, p, n);
    ctx.buflen += n;
    if (ctx.buflen != 64)
      return;
    p += n;
    size -= n;
    ctx.buflen = 0;
    std::uint32_t block[sha1::BLOCK_INTS];
    sha1::make_block(ctx.buf, block);
    sha1::transform(ctx.digest, block);
    ++ctx.blocks;
  }
}